

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall
cmSetPropertyCommand::InitialPass
          (cmSetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  ostringstream e;
  undefined4 local_1ec;
  string local_1e0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_1c0;
  string *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar4 == 0) {
      local_1ec = 3;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar4 == 0) {
        local_1ec = 2;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar4 == 0) {
          local_1ec = 0;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)pbVar1);
          if (iVar4 == 0) {
            local_1ec = 1;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)pbVar1);
            if (iVar4 == 0) {
              local_1ec = 5;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)pbVar1);
              if (iVar4 == 0) {
                local_1ec = 4;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)pbVar1);
                if (iVar4 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"given invalid scope ",0x14);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,(pbVar1->_M_dataplus)._M_p,
                                      pbVar1->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,".  ",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,
                             "Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                             ,0x49);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1e0);
LAB_00283e85:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                    operator_delete(local_1e0._M_dataplus._M_p,
                                    local_1e0.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  return false;
                }
                local_1ec = 8;
              }
            }
          }
        }
      }
    }
    __v = pbVar1 + 1;
    if (__v != (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      local_1b0 = &this->PropertyValue;
      local_1b8 = (string *)&this->PropertyName;
      local_1c0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)&this->Names;
      iVar4 = 1;
LAB_00283c0a:
      iVar5 = std::__cxx11::string::compare((char *)__v);
      if (iVar5 == 0) {
        iVar4 = 2;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)__v);
        if (iVar5 == 0) {
          this->Remove = false;
          this->AppendMode = true;
          this->AppendAsString = false;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__v);
          psVar2 = local_1b0;
          if (iVar5 != 0) {
            if (iVar4 == 3) {
              std::__cxx11::string::append((char *)local_1b0);
              std::__cxx11::string::_M_append((char *)psVar2,(ulong)(__v->_M_dataplus)._M_p);
              this->Remove = false;
              iVar4 = 3;
            }
            else {
              if (iVar4 != 2) {
                if (iVar4 == 1) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>(local_1c0,__v);
                  iVar4 = 1;
                  goto LAB_00283c93;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"given invalid argument \"",0x18);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(__v->_M_dataplus)._M_p,
                                    __v->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1e0);
                goto LAB_00283e85;
              }
              std::__cxx11::string::_M_assign(local_1b8);
              iVar4 = 3;
            }
            goto LAB_00283c93;
          }
          this->Remove = false;
          this->AppendMode = true;
          this->AppendAsString = true;
        }
        iVar4 = 0;
      }
LAB_00283c93:
      __v = __v + 1;
      if (__v == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00283cf4;
      goto LAB_00283c0a;
    }
LAB_00283cf4:
    if ((this->PropertyName)._M_string_length != 0) {
      switch(local_1ec) {
      case 0:
        bVar3 = HandleTargetMode(this);
        return bVar3;
      case 1:
        bVar3 = HandleSourceMode(this);
        return bVar3;
      case 2:
        bVar3 = HandleDirectoryMode(this);
        return bVar3;
      case 3:
        bVar3 = HandleGlobalMode(this);
        return bVar3;
      case 4:
        bVar3 = HandleCacheMode(this);
        return bVar3;
      case 5:
        bVar3 = HandleTestMode(this);
        return bVar3;
      default:
        return true;
      case 8:
        bVar3 = HandleInstallMode(this);
        return bVar3;
      }
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"not given a PROPERTY <name> argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool cmSetPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Get the scope on which to set the property.
  std::vector<std::string>::const_iterator arg = args.begin();
  cmProperty::ScopeType scope;
  if(*arg == "GLOBAL")
    {
    scope = cmProperty::GLOBAL;
    }
  else if(*arg == "DIRECTORY")
    {
    scope = cmProperty::DIRECTORY;
    }
  else if(*arg == "TARGET")
    {
    scope = cmProperty::TARGET;
    }
  else if(*arg == "SOURCE")
    {
    scope = cmProperty::SOURCE_FILE;
    }
  else if(*arg == "TEST")
    {
    scope = cmProperty::TEST;
    }
  else if(*arg == "CACHE")
    {
    scope = cmProperty::CACHE;
    }
  else if(*arg == "INSTALL")
    {
    scope = cmProperty::INSTALL;
    }
  else
    {
    std::ostringstream e;
    e << "given invalid scope " << *arg << ".  "
      << "Valid scopes are GLOBAL, DIRECTORY, "
        "TARGET, SOURCE, TEST, CACHE, INSTALL.";
    this->SetError(e.str());
    return false;
    }

  // Parse the rest of the arguments up to the values.
  enum Doing { DoingNone, DoingNames, DoingProperty, DoingValues };
  Doing doing = DoingNames;
  const char* sep = "";
  for(++arg; arg != args.end(); ++arg)
    {
    if(*arg == "PROPERTY")
      {
      doing = DoingProperty;
      }
    else if(*arg == "APPEND")
      {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = false;
      }
    else if(*arg == "APPEND_STRING")
      {
      doing = DoingNone;
      this->AppendMode = true;
      this->Remove = false;
      this->AppendAsString = true;
      }
    else if(doing == DoingNames)
      {
      this->Names.insert(*arg);
      }
    else if(doing == DoingProperty)
      {
      this->PropertyName = *arg;
      doing = DoingValues;
      }
    else if(doing == DoingValues)
      {
      this->PropertyValue += sep;
      sep = ";";
      this->PropertyValue += *arg;
      this->Remove = false;
      }
    else
      {
      std::ostringstream e;
      e << "given invalid argument \"" << *arg << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Make sure a property name was found.
  if(this->PropertyName.empty())
    {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
    }

  // Dispatch property setting.
  switch(scope)
    {
    case cmProperty::GLOBAL:      return this->HandleGlobalMode();
    case cmProperty::DIRECTORY:   return this->HandleDirectoryMode();
    case cmProperty::TARGET:      return this->HandleTargetMode();
    case cmProperty::SOURCE_FILE: return this->HandleSourceMode();
    case cmProperty::TEST:        return this->HandleTestMode();
    case cmProperty::CACHE:       return this->HandleCacheMode();
    case cmProperty::INSTALL:     return this->HandleInstallMode();

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
    }
  return true;
}